

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::unary<tcu::Vector<double,_4>,_tcu::Vector<double,_4>_>::call
          (unary<tcu::Vector<double,_4>,_tcu::Vector<double,_4>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(&local_30);
  *(undefined8 *)((long)result_dst + 0x10) = local_20;
  *(undefined8 *)((long)result_dst + 0x18) = uStack_18;
  *(undefined8 *)result_dst = local_30;
  *(undefined8 *)((long)result_dst + 8) = uStack_28;
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}